

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

parser_error parse_profile_streamer(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"den");
    *(wchar_t *)((long)pvVar3 + 0x58) = wVar1;
    wVar1 = parser_getint(p,"rng");
    *(wchar_t *)((long)pvVar3 + 0x5c) = wVar1;
    wVar1 = parser_getint(p,"mag");
    *(wchar_t *)((long)pvVar3 + 0x60) = wVar1;
    wVar1 = parser_getint(p,"mc");
    *(wchar_t *)((long)pvVar3 + 100) = wVar1;
    wVar1 = parser_getint(p,"qua");
    *(wchar_t *)((long)pvVar3 + 0x68) = wVar1;
    wVar1 = parser_getint(p,"qc");
    *(wchar_t *)((long)pvVar3 + 0x6c) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_profile_streamer(struct parser *p) {
	struct cave_profile *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->str.den = parser_getint(p, "den");
	c->str.rng = parser_getint(p, "rng");
	c->str.mag = parser_getint(p, "mag");
	c->str.mc  = parser_getint(p, "mc");
	c->str.qua = parser_getint(p, "qua");
	c->str.qc  = parser_getint(p, "qc");
	return PARSE_ERROR_NONE;
}